

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O1

UChar32 __thiscall
icu_63::FullCaseFoldingIterator::next(FullCaseFoldingIterator *this,UnicodeString *full)

{
  UChar UVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint textLength;
  ulong uVar6;
  UChar *pUVar7;
  ConstChar16Ptr local_28 [3];
  
  iVar2 = this->unfoldRowWidth;
  pUVar7 = this->unfold + iVar2 * this->currentRow;
  if ((iVar2 <= this->rowCpIndex) || (pUVar7[this->rowCpIndex] == L'\0')) {
    this->currentRow = this->currentRow + 1;
    pUVar7 = pUVar7 + iVar2;
    this->rowCpIndex = this->unfoldStringWidth;
  }
  uVar4 = 0xffffffff;
  if (this->currentRow < this->unfoldRows) {
    uVar4 = this->unfoldStringWidth;
    uVar6 = (ulong)uVar4;
    uVar5 = uVar4 + 1;
    do {
      textLength = (int)uVar4 >> 0x1f & uVar4;
      if ((int)uVar6 < 1) break;
      uVar5 = uVar5 - 1;
      lVar3 = uVar6 - 1;
      uVar6 = uVar6 - 1;
      textLength = uVar5;
    } while (pUVar7[lVar3] == L'\0');
    local_28[0].p_ = pUVar7;
    UnicodeString::setTo(full,'\0',local_28,textLength);
    iVar2 = this->rowCpIndex;
    this->rowCpIndex = iVar2 + 1;
    UVar1 = pUVar7[iVar2];
    uVar4 = (uint)(ushort)UVar1;
    if ((UVar1 & 0xfc00U) == 0xd800) {
      this->rowCpIndex = iVar2 + 2;
      uVar4 = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)pUVar7[(long)iVar2 + 1] + 0xfca02400;
    }
  }
  return uVar4;
}

Assistant:

UChar32
FullCaseFoldingIterator::next(UnicodeString &full) {
    // Advance past the last-delivered code point.
    const UChar *p=unfold+(currentRow*unfoldRowWidth);
    if(rowCpIndex>=unfoldRowWidth || p[rowCpIndex]==0) {
        ++currentRow;
        p+=unfoldRowWidth;
        rowCpIndex=unfoldStringWidth;
    }
    if(currentRow>=unfoldRows) { return U_SENTINEL; }
    // Set "full" to the NUL-terminated string in the first unfold column.
    int32_t length=unfoldStringWidth;
    while(length>0 && p[length-1]==0) { --length; }
    full.setTo(FALSE, p, length);
    // Return the code point.
    UChar32 c;
    U16_NEXT_UNSAFE(p, rowCpIndex, c);
    return c;
}